

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O1

void FS_TakeInventory(AActor *actor,char *type,int amount)

{
  int *piVar1;
  int iVar2;
  PClassActor *type_00;
  AInventory *pAVar3;
  undefined4 extraout_var;
  char *name;
  
  if (0 < amount) {
    iVar2 = strcmp(type,"Armor");
    name = "BasicArmor";
    if (iVar2 != 0) {
      name = type;
    }
    type_00 = PClass::FindActor(name);
    if (type_00 != (PClassActor *)0x0) {
      pAVar3 = AActor::FindInventory(actor,type_00,false);
      if (pAVar3 != (AInventory *)0x0) {
        piVar1 = &pAVar3->Amount;
        iVar2 = *piVar1;
        *piVar1 = *piVar1 - amount;
        if (*piVar1 == 0 || SBORROW4(iVar2,amount) != *piVar1 < 0) {
          if ((pAVar3->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
            iVar2 = (**(pAVar3->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar3);
            (pAVar3->super_AActor).super_DThinker.super_DObject.Class =
                 (PClass *)CONCAT44(extraout_var,iVar2);
          }
          if (((pAVar3->super_AActor).super_DThinker.super_DObject.Class)->ParentClass !=
              AAmmo::RegistrationInfo.MyClass) {
            (*(pAVar3->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar3);
            return;
          }
          pAVar3->Amount = 0;
        }
      }
    }
  }
  return;
}

Assistant:

static void FS_TakeInventory (AActor *actor, const char * type, int amount)
{
	if (strcmp (type, "Armor") == 0)
	{
		type = "BasicArmor";
	}
	if (amount <= 0)
	{
		return;
	}
	PClassActor * info = PClass::FindActor (type);
	if (info == NULL)
	{
		return;
	}

	AInventory *item = actor->FindInventory (info);
	if (item != NULL)
	{
		item->Amount -= amount;
		if (item->Amount <= 0)
		{
			// If it's not ammo, destroy it. Ammo needs to stick around, even
			// when it's zero for the benefit of the weapons that use it and 
			// to maintain the maximum ammo amounts a backpack might have given.
			if (item->GetClass()->ParentClass != RUNTIME_CLASS(AAmmo))
			{
				item->Destroy ();
			}
			else
			{
				item->Amount = 0;
			}
		}
	}
}